

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentVarLocation.cpp
# Opt level: O3

void __thiscall
license::locate::EnvironmentVarLocation::~EnvironmentVarLocation(EnvironmentVarLocation *this)

{
  pointer pcVar1;
  
  (this->super_LocatorStrategy)._vptr_LocatorStrategy =
       (_func_int **)&PTR_get_strategy_name_abi_cxx11__00568ea8;
  pcVar1 = (this->super_LocatorStrategy).m_strategy_name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_LocatorStrategy).m_strategy_name.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

EnvironmentVarLocation::~EnvironmentVarLocation() {}